

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O0

void __thiscall
presolve::HighsPostsolveStack::fixedColAtZero<HighsTripletListSlice>
          (HighsPostsolveStack *this,HighsInt col,double colCost,
          HighsMatrixSlice<HighsTripletListSlice> *colVec)

{
  bool bVar1;
  reference this_00;
  char *pcVar2;
  int __c;
  undefined8 in_RDX;
  int in_ESI;
  iterator *rhs;
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  *in_RDI;
  HighsSliceNonzero *colVal;
  iterator __end0;
  iterator __begin0;
  HighsMatrixSlice<HighsTripletListSlice> *__range2;
  HighsMatrixSlice<HighsTripletListSlice> *in_stack_ffffffffffffff50;
  vector<int,_std::allocator<int>_> *this_01;
  FixedCol *in_stack_ffffffffffffff58;
  ReductionType type;
  HighsPostsolveStack *in_stack_ffffffffffffff60;
  HighsDataStack *this_02;
  iterator local_68;
  iterator local_48;
  undefined8 local_28;
  undefined8 local_20;
  int local_c;
  
  local_20 = in_RDX;
  local_c = in_ESI;
  std::
  vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
  ::clear((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           *)0x727550);
  local_28 = local_20;
  HighsMatrixSlice<HighsTripletListSlice>::begin(in_stack_ffffffffffffff50);
  HighsMatrixSlice<HighsTripletListSlice>::end(in_stack_ffffffffffffff50);
  while( true ) {
    rhs = &local_68;
    bVar1 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_48,rhs);
    if (!bVar1) break;
    this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_48);
    in_stack_ffffffffffffff58 = (FixedCol *)(in_RDI + 8);
    this_01 = (vector<int,_std::allocator<int>_> *)(in_RDI + 5);
    pcVar2 = HighsSliceNonzero::index(this_00,(char *)rhs,__c);
    in_stack_ffffffffffffff60 =
         (HighsPostsolveStack *)
         std::vector<int,_std::allocator<int>_>::operator[](this_01,(long)(int)pcVar2);
    HighsSliceNonzero::value(this_00);
    std::
    vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
    ::emplace_back<int&,double>
              ((vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
                *)in_stack_ffffffffffffff60,(int *)in_stack_ffffffffffffff58,(double *)this_01);
    HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_48);
  }
  this_02 = (HighsDataStack *)0x0;
  std::vector<int,_std::allocator<int>_>::operator[]
            ((vector<int,_std::allocator<int>_> *)(in_RDI + 4),(long)local_c);
  HighsDataStack::push<presolve::HighsPostsolveStack::FixedCol,_0>
            ((HighsDataStack *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  type = (ReductionType)((ulong)in_stack_ffffffffffffff58 >> 0x38);
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>(this_02,in_RDI);
  reductionAdded(in_stack_ffffffffffffff60,type);
  return;
}

Assistant:

void fixedColAtZero(HighsInt col, double colCost,
                      const HighsMatrixSlice<ColStorageFormat>& colVec) {
    colValues.clear();
    for (const HighsSliceNonzero& colVal : colVec)
      colValues.emplace_back(origRowIndex[colVal.index()], colVal.value());

    reductionValues.push(
        FixedCol{0.0, colCost, origColIndex[col], HighsBasisStatus::kZero});
    reductionValues.push(colValues);
    reductionAdded(ReductionType::kFixedCol);
  }